

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisAngularAccelerometerSensor.cpp
# Opt level: O2

string * __thiscall
iDynTree::ThreeAxisAngularAccelerometerSensor::getName_abi_cxx11_
          (string *__return_storage_ptr__,ThreeAxisAngularAccelerometerSensor *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this->pimpl);
  return __return_storage_ptr__;
}

Assistant:

std::string ThreeAxisAngularAccelerometerSensor::getName() const
{
    return this->pimpl->name;
}